

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClient_LL_UploadToBlob_SetOption
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle,char *optionName,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined4 uVar3;
  LOGGER_LOG l_18;
  char *tempCopy_1;
  LOGGER_LOG l_17;
  LOGGER_LOG l_16;
  LOGGER_LOG l_15;
  LOGGER_LOG l_14;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  HTTP_PROXY_OPTIONS *proxy_options;
  LOGGER_LOG l_11;
  char *tempCopy;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  char *temp_3;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  int *temp_2;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  char *temp_1;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  char *temp;
  LOGGER_LOG l_1;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *upload_data;
  LOGGER_LOG l;
  LOGGER_LOG p_Stack_28;
  IOTHUB_CLIENT_RESULT result;
  void *value_local;
  char *optionName_local;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle_local;
  
  p_Stack_28 = (LOGGER_LOG)value;
  value_local = optionName;
  optionName_local = (char *)handle;
  if (handle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)0x0) {
    upload_data = (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *)xlogging_get_log_function();
    if (upload_data != (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *)0x0) {
      (*(code *)upload_data)
                (0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                 ,"IoTHubClient_LL_UploadToBlob_SetOption",0x4e7,1,
                 "invalid argument detected: IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle=%p, const char* optionName=%s, const void* value=%p"
                 ,optionName_local,value_local,p_Stack_28);
    }
    l._4_4_ = IOTHUB_CLIENT_ERROR;
  }
  else {
    l_1 = (LOGGER_LOG)handle;
    iVar1 = strcmp(optionName,OPTION_X509_CERT);
    if (iVar1 == 0) {
      if ((*(int *)(l_1 + 0x18) == 2) || (*(int *)(l_1 + 0x18) == 3)) {
        iVar1 = mallocAndStrcpy_s((char **)&l_2,(char *)p_Stack_28);
        if (iVar1 == 0) {
          if (*(long *)(l_1 + 0x20) != 0) {
            free(*(void **)(l_1 + 0x20));
          }
          *(LOGGER_LOG *)(l_1 + 0x20) = l_2;
          l._4_4_ = IOTHUB_CLIENT_OK;
        }
        else {
          l_3 = xlogging_get_log_function();
          if (l_3 != (LOGGER_LOG)0x0) {
            (*l_3)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                   ,"IoTHubClient_LL_UploadToBlob_SetOption",0x4fb,1,"unable to mallocAndStrcpy_s");
          }
          l._4_4_ = IOTHUB_CLIENT_ERROR;
        }
      }
      else {
        temp = (char *)xlogging_get_log_function();
        if ((LOGGER_LOG)temp != (LOGGER_LOG)0x0) {
          (*(code *)temp)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                          ,"IoTHubClient_LL_UploadToBlob_SetOption",0x4f2,1,
                          "trying to set a x509 certificate while the authentication scheme is not x509"
                         );
        }
        l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
      }
    }
    else {
      iVar1 = strcmp((char *)value_local,OPTION_X509_PRIVATE_KEY);
      if (iVar1 == 0) {
        if ((*(int *)(l_1 + 0x18) == 2) || (*(int *)(l_1 + 0x18) == 3)) {
          iVar1 = mallocAndStrcpy_s((char **)&l_4,(char *)p_Stack_28);
          if (iVar1 == 0) {
            if (*(long *)(l_1 + 0x28) != 0) {
              free(*(void **)(l_1 + 0x28));
            }
            *(LOGGER_LOG *)(l_1 + 0x28) = l_4;
            l._4_4_ = IOTHUB_CLIENT_OK;
          }
          else {
            l_5 = xlogging_get_log_function();
            if (l_5 != (LOGGER_LOG)0x0) {
              (*l_5)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                     ,"IoTHubClient_LL_UploadToBlob_SetOption",0x516,1,"unable to mallocAndStrcpy_s"
                    );
            }
            l._4_4_ = IOTHUB_CLIENT_ERROR;
          }
        }
        else {
          temp_1 = (char *)xlogging_get_log_function();
          if ((LOGGER_LOG)temp_1 != (LOGGER_LOG)0x0) {
            (*(code *)temp_1)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                              ,"IoTHubClient_LL_UploadToBlob_SetOption",0x50d,1,
                              "trying to set a x509 privatekey while the authentication scheme is not x509"
                             );
          }
          l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
        }
      }
      else {
        iVar1 = strcmp("x509PrivatekeyType",(char *)value_local);
        if (iVar1 == 0) {
          if ((*(int *)(l_1 + 0x18) == 2) || (*(int *)(l_1 + 0x18) == 3)) {
            if (p_Stack_28 == (LOGGER_LOG)0x0) {
              temp_2 = (int *)xlogging_get_log_function();
              if ((LOGGER_LOG)temp_2 != (LOGGER_LOG)0x0) {
                (*(code *)temp_2)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                  ,"IoTHubClient_LL_UploadToBlob_SetOption",0x52d,1,
                                  "NULL is a not a valid value for x509 private key type");
              }
              l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
            }
            else {
              l_7 = (LOGGER_LOG)malloc(4);
              if (l_7 == (LOGGER_LOG)0x0) {
                l_8 = xlogging_get_log_function();
                if (l_8 != (LOGGER_LOG)0x0) {
                  (*l_8)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                         ,"IoTHubClient_LL_UploadToBlob_SetOption",0x535,1,"failure in malloc");
                }
                l._4_4_ = IOTHUB_CLIENT_ERROR;
              }
              else {
                *(undefined4 *)l_7 = *(undefined4 *)p_Stack_28;
                if (*(long *)(l_1 + 0x30) != 0) {
                  free(*(void **)(l_1 + 0x30));
                }
                *(LOGGER_LOG *)(l_1 + 0x30) = l_7;
                l._4_4_ = IOTHUB_CLIENT_OK;
              }
            }
          }
          else {
            l_6 = xlogging_get_log_function();
            if (l_6 != (LOGGER_LOG)0x0) {
              (*l_6)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                     ,"IoTHubClient_LL_UploadToBlob_SetOption",0x528,1,
                     "trying to set a x509 private key type while the authentication scheme is not x509"
                    );
            }
            l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
          }
        }
        else {
          iVar1 = strcmp("Engine",(char *)value_local);
          if (iVar1 == 0) {
            if ((*(int *)(l_1 + 0x18) == 2) || (*(int *)(l_1 + 0x18) == 3)) {
              iVar1 = mallocAndStrcpy_s((char **)&l_9,(char *)p_Stack_28);
              if (iVar1 == 0) {
                if (*(long *)(l_1 + 0x38) != 0) {
                  free(*(void **)(l_1 + 0x38));
                }
                *(LOGGER_LOG *)(l_1 + 0x38) = l_9;
                l._4_4_ = IOTHUB_CLIENT_OK;
              }
              else {
                l_10 = xlogging_get_log_function();
                if (l_10 != (LOGGER_LOG)0x0) {
                  (*l_10)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                          ,"IoTHubClient_LL_UploadToBlob_SetOption",0x550,1,
                          "failure in mallocAndStrcpy_s");
                }
                l._4_4_ = IOTHUB_CLIENT_ERROR;
              }
            }
            else {
              temp_3 = (char *)xlogging_get_log_function();
              if ((LOGGER_LOG)temp_3 != (LOGGER_LOG)0x0) {
                (*(code *)temp_3)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                  ,"IoTHubClient_LL_UploadToBlob_SetOption",0x548,1,
                                  "trying to set an openssl engine while the authentication scheme is not x509"
                                 );
              }
              l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
            }
          }
          else {
            iVar1 = strcmp("TrustedCerts",(char *)value_local);
            if (iVar1 == 0) {
              if (p_Stack_28 == (LOGGER_LOG)0x0) {
                tempCopy = (char *)xlogging_get_log_function();
                if ((LOGGER_LOG)tempCopy != (LOGGER_LOG)0x0) {
                  (*(code *)tempCopy)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                      ,"IoTHubClient_LL_UploadToBlob_SetOption",0x562,1,
                                      "NULL is a not a valid value for TrustedCerts");
                }
                l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
              }
              else {
                iVar1 = mallocAndStrcpy_s((char **)&l_11,(char *)p_Stack_28);
                if (iVar1 == 0) {
                  if (*(long *)(l_1 + 0x40) != 0) {
                    free(*(void **)(l_1 + 0x40));
                  }
                  *(LOGGER_LOG *)(l_1 + 0x40) = l_11;
                  l._4_4_ = IOTHUB_CLIENT_OK;
                }
                else {
                  proxy_options = (HTTP_PROXY_OPTIONS *)xlogging_get_log_function();
                  if (proxy_options != (HTTP_PROXY_OPTIONS *)0x0) {
                    (*(code *)proxy_options)
                              (0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                               ,"IoTHubClient_LL_UploadToBlob_SetOption",0x56a,1,
                               "failure in mallocAndStrcpy_s");
                  }
                  l._4_4_ = IOTHUB_CLIENT_ERROR;
                }
              }
            }
            else {
              iVar1 = strcmp((char *)value_local,"proxy_data");
              if (iVar1 == 0) {
                l_12 = p_Stack_28;
                if (*(long *)p_Stack_28 == 0) {
                  l_13 = xlogging_get_log_function();
                  if (l_13 != (LOGGER_LOG)0x0) {
                    (*l_13)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                            ,"IoTHubClient_LL_UploadToBlob_SetOption",0x57e,1,
                            "NULL host_address in proxy options");
                  }
                  l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
                }
                else if (((*(long *)(p_Stack_28 + 0x10) == 0) || (*(long *)(p_Stack_28 + 0x18) == 0)
                         ) && (*(long *)(p_Stack_28 + 0x10) != *(long *)(p_Stack_28 + 0x18))) {
                  l_14 = xlogging_get_log_function();
                  if (l_14 != (LOGGER_LOG)0x0) {
                    (*l_14)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                            ,"IoTHubClient_LL_UploadToBlob_SetOption",0x584,1,
                            "Only one of username and password for proxy settings was NULL");
                  }
                  l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
                }
                else {
                  if (*(long *)(l_1 + 0x48) != 0) {
                    free(*(void **)(l_1 + 0x48));
                    *(undefined8 *)(l_1 + 0x48) = 0;
                  }
                  if (*(long *)(l_1 + 0x58) != 0) {
                    free(*(void **)(l_1 + 0x58));
                    *(undefined8 *)(l_1 + 0x58) = 0;
                  }
                  if (*(long *)(l_1 + 0x60) != 0) {
                    free(*(void **)(l_1 + 0x60));
                    *(undefined8 *)(l_1 + 0x60) = 0;
                  }
                  *(undefined4 *)(l_1 + 0x50) = *(undefined4 *)(l_12 + 8);
                  iVar1 = mallocAndStrcpy_s((char **)(l_1 + 0x48),*(char **)l_12);
                  if (iVar1 == 0) {
                    if ((*(long *)(l_12 + 0x10) == 0) ||
                       (iVar1 = mallocAndStrcpy_s((char **)(l_1 + 0x58),*(char **)(l_12 + 0x10)),
                       iVar1 == 0)) {
                      if ((*(long *)(l_12 + 0x18) == 0) ||
                         (iVar1 = mallocAndStrcpy_s((char **)(l_1 + 0x60),*(char **)(l_12 + 0x18)),
                         iVar1 == 0)) {
                        l._4_4_ = IOTHUB_CLIENT_OK;
                      }
                      else {
                        l_17 = xlogging_get_log_function();
                        if (l_17 != (LOGGER_LOG)0x0) {
                          (*l_17)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                  ,"IoTHubClient_LL_UploadToBlob_SetOption",0x5a7,1,
                                  "failure in mallocAndStrcpy_s - upload_data->http_proxy_options.password"
                                 );
                        }
                        l._4_4_ = IOTHUB_CLIENT_ERROR;
                      }
                    }
                    else {
                      l_16 = xlogging_get_log_function();
                      if (l_16 != (LOGGER_LOG)0x0) {
                        (*l_16)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                ,"IoTHubClient_LL_UploadToBlob_SetOption",0x5a2,1,
                                "failure in mallocAndStrcpy_s - upload_data->http_proxy_options.username"
                               );
                      }
                      l._4_4_ = IOTHUB_CLIENT_ERROR;
                    }
                  }
                  else {
                    l_15 = xlogging_get_log_function();
                    if (l_15 != (LOGGER_LOG)0x0) {
                      (*l_15)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                              ,"IoTHubClient_LL_UploadToBlob_SetOption",0x59d,1,
                              "failure in mallocAndStrcpy_s - upload_data->http_proxy_options.host_address"
                             );
                    }
                    l._4_4_ = IOTHUB_CLIENT_ERROR;
                  }
                }
              }
              else {
                iVar1 = strcmp((char *)value_local,"CURLOPT_VERBOSE");
                if (iVar1 == 0) {
                  uVar3 = 1;
                  if (((byte)*p_Stack_28 & 1) == 0) {
                    uVar3 = 2;
                  }
                  *(undefined4 *)(l_1 + 0x68) = uVar3;
                  l._4_4_ = IOTHUB_CLIENT_OK;
                }
                else {
                  iVar1 = strcmp((char *)value_local,OPTION_BLOB_UPLOAD_TIMEOUT_SECS);
                  if (iVar1 == 0) {
                    *(long *)(l_1 + 0x70) = *(long *)p_Stack_28 * 1000;
                    l._4_4_ = IOTHUB_CLIENT_OK;
                  }
                  else {
                    iVar1 = strcmp((char *)value_local,"network_interface_upload_to_blob");
                    if (iVar1 == 0) {
                      if (p_Stack_28 == (LOGGER_LOG)0x0) {
                        tempCopy_1 = (char *)xlogging_get_log_function();
                        if ((LOGGER_LOG)tempCopy_1 != (LOGGER_LOG)0x0) {
                          (*(code *)tempCopy_1)
                                    (AZ_LOG_ERROR,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                     ,"IoTHubClient_LL_UploadToBlob_SetOption",0x5be,1,
                                     "NULL is not a valid value for networkInterface option");
                        }
                        l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
                      }
                      else {
                        iVar1 = mallocAndStrcpy_s((char **)&l_18,(char *)p_Stack_28);
                        if (iVar1 == 0) {
                          if (*(long *)(l_1 + 0x78) != 0) {
                            free(*(void **)(l_1 + 0x78));
                          }
                          *(LOGGER_LOG *)(l_1 + 0x78) = l_18;
                          l._4_4_ = IOTHUB_CLIENT_OK;
                        }
                        else {
                          p_Var2 = xlogging_get_log_function();
                          if (p_Var2 != (LOGGER_LOG)0x0) {
                            (*p_Var2)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                      ,"IoTHubClient_LL_UploadToBlob_SetOption",0x5c6,1,
                                      "failure in mallocAndStrcpy_s");
                          }
                          l._4_4_ = IOTHUB_CLIENT_ERROR;
                        }
                      }
                    }
                    else {
                      iVar1 = strcmp((char *)value_local,OPTION_BLOB_UPLOAD_TLS_RENEGOTIATION);
                      if (iVar1 == 0) {
                        l_1[0x80] = (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs
                                     )((byte)*p_Stack_28 & 1);
                      }
                      l._4_4_ = (IOTHUB_CLIENT_RESULT)(iVar1 != 0);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClient_LL_UploadToBlob_SetOption(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle, const char* optionName, const void* value)
{
    IOTHUB_CLIENT_RESULT result;
    if (handle == NULL)
    {
        LogError("invalid argument detected: IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle=%p, const char* optionName=%s, const void* value=%p", handle, optionName, value);
        result = IOTHUB_CLIENT_ERROR;
    }
    else
    {
        IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_data = (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA*)handle;

        if (strcmp(optionName, OPTION_X509_CERT) == 0)
        {
            if (upload_data->cred_type != IOTHUB_CREDENTIAL_TYPE_X509 && upload_data->cred_type != IOTHUB_CREDENTIAL_TYPE_X509_ECC)
            {
                LogError("trying to set a x509 certificate while the authentication scheme is not x509");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                /*try to make a copy of the certificate*/
                char* temp;
                if (mallocAndStrcpy_s(&temp, value) != 0)
                {
                    LogError("unable to mallocAndStrcpy_s");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    if (upload_data->credentials.x509_credentials.x509certificate != NULL) /*free any previous values, if any*/
                    {
                        free(upload_data->credentials.x509_credentials.x509certificate);
                    }
                    upload_data->credentials.x509_credentials.x509certificate = temp;
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else if (strcmp(optionName, OPTION_X509_PRIVATE_KEY) == 0)
        {
            if (upload_data->cred_type != IOTHUB_CREDENTIAL_TYPE_X509 && upload_data->cred_type != IOTHUB_CREDENTIAL_TYPE_X509_ECC)
            {
                LogError("trying to set a x509 privatekey while the authentication scheme is not x509");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                /*try to make a copy of the privatekey*/
                char* temp;
                if (mallocAndStrcpy_s(&temp, value) != 0)
                {
                    LogError("unable to mallocAndStrcpy_s");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    if (upload_data->credentials.x509_credentials.x509privatekey != NULL) /*free any previous values, if any*/
                    {
                        free(upload_data->credentials.x509_credentials.x509privatekey);
                    }
                    upload_data->credentials.x509_credentials.x509privatekey = temp;
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else if (strcmp(OPTION_OPENSSL_PRIVATE_KEY_TYPE, optionName) == 0)
        {
            if (upload_data->cred_type != IOTHUB_CREDENTIAL_TYPE_X509 && upload_data->cred_type != IOTHUB_CREDENTIAL_TYPE_X509_ECC)
            {
                LogError("trying to set a x509 private key type while the authentication scheme is not x509");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else if (value == NULL)
            {
                LogError("NULL is a not a valid value for x509 private key type");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                int* temp = malloc(sizeof(int));
                if (temp == NULL)
                {
                    LogError("failure in malloc");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    *temp = *(int*)value;
                    if (upload_data->credentials.x509_credentials.x509privatekeyType != NULL)
                    {
                        free(upload_data->credentials.x509_credentials.x509privatekeyType);
                    }
                    upload_data->credentials.x509_credentials.x509privatekeyType = temp;
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else if (strcmp(OPTION_OPENSSL_ENGINE, optionName) == 0)
        {
            if (upload_data->cred_type != IOTHUB_CREDENTIAL_TYPE_X509 && upload_data->cred_type != IOTHUB_CREDENTIAL_TYPE_X509_ECC)
            {
                LogError("trying to set an openssl engine while the authentication scheme is not x509");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                char* temp;
                if (mallocAndStrcpy_s(&temp, value) != 0)
                {
                    LogError("failure in mallocAndStrcpy_s");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    if (upload_data->credentials.x509_credentials.engine != NULL)
                    {
                        free(upload_data->credentials.x509_credentials.engine);
                    }
                    upload_data->credentials.x509_credentials.engine = temp;
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else if (strcmp(OPTION_TRUSTED_CERT, optionName) == 0)
        {
            if (value == NULL)
            {
                LogError("NULL is a not a valid value for TrustedCerts");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                char* tempCopy;
                if (mallocAndStrcpy_s(&tempCopy, value) != 0)
                {
                    LogError("failure in mallocAndStrcpy_s");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    if (upload_data->certificates != NULL)
                    {
                        free(upload_data->certificates);
                    }
                    upload_data->certificates = tempCopy;
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else if (strcmp(optionName, OPTION_HTTP_PROXY) == 0)
        {
            HTTP_PROXY_OPTIONS* proxy_options = (HTTP_PROXY_OPTIONS *)value;

            if (proxy_options->host_address == NULL)
            {
                LogError("NULL host_address in proxy options");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else if (((proxy_options->username == NULL) || (proxy_options->password == NULL)) &&
                (proxy_options->username != proxy_options->password))
            {
                LogError("Only one of username and password for proxy settings was NULL");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                if (upload_data->http_proxy_options.host_address != NULL)
                {
                    free((char *)upload_data->http_proxy_options.host_address);
                    upload_data->http_proxy_options.host_address = NULL;
                }
                if (upload_data->http_proxy_options.username != NULL)
                {
                    free((char *)upload_data->http_proxy_options.username);
                    upload_data->http_proxy_options.username = NULL;
                }
                if (upload_data->http_proxy_options.password != NULL)
                {
                    free((char *)upload_data->http_proxy_options.password);
                    upload_data->http_proxy_options.password = NULL;
                }

                upload_data->http_proxy_options.port = proxy_options->port;

                if (mallocAndStrcpy_s((char **)(&upload_data->http_proxy_options.host_address), proxy_options->host_address) != 0)
                {
                    LogError("failure in mallocAndStrcpy_s - upload_data->http_proxy_options.host_address");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else if (proxy_options->username != NULL && mallocAndStrcpy_s((char **)(&upload_data->http_proxy_options.username), proxy_options->username) != 0)
                {
                    LogError("failure in mallocAndStrcpy_s - upload_data->http_proxy_options.username");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else if (proxy_options->password != NULL && mallocAndStrcpy_s((char **)(&upload_data->http_proxy_options.password), proxy_options->password) != 0)
                {
                    LogError("failure in mallocAndStrcpy_s - upload_data->http_proxy_options.password");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else if (strcmp(optionName, OPTION_CURL_VERBOSE) == 0)
        {
            upload_data->curl_verbosity_level = ((*(bool*)value) == 0) ? UPLOADTOBLOB_CURL_VERBOSITY_OFF : UPLOADTOBLOB_CURL_VERBOSITY_ON;
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp(optionName, OPTION_BLOB_UPLOAD_TIMEOUT_SECS) == 0)
        {
            upload_data->blob_upload_timeout_millisecs = 1000 * (*(size_t*)value);
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp(optionName, OPTION_NETWORK_INTERFACE_UPLOAD_TO_BLOB) == 0)
        {
            if (value == NULL)
            {
                LogError("NULL is not a valid value for networkInterface option");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                char* tempCopy;
                if (mallocAndStrcpy_s(&tempCopy, value) != 0)
                {
                    LogError("failure in mallocAndStrcpy_s");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    if (upload_data->networkInterface != NULL)
                    {
                        free((char*)upload_data->networkInterface);
                    }
                    upload_data->networkInterface = tempCopy;
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else if (strcmp(optionName, OPTION_BLOB_UPLOAD_TLS_RENEGOTIATION) == 0)
        {
            upload_data->tls_renegotiation = *((bool*)(value));
            result = IOTHUB_CLIENT_OK;
        }
        else
        {
            result = IOTHUB_CLIENT_INVALID_ARG;
        }
    }
    return result;
}